

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::internalDelayedPopup(QMenu *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QMenuPrivate *pQVar6;
  QMenu *pQVar7;
  QAction *pQVar8;
  ulong uVar9;
  QGraphicsProxyWidget *pQVar10;
  QStyle *pQVar11;
  int *piVar12;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QList<QAction_*> *subMenuActions;
  int ofs;
  int subMenuOffset;
  bool isEmbedded;
  QMenu *menu;
  QMenuPrivate *d;
  QEvent leaveEvent;
  QRect subMenuActionRect;
  QPoint subMenuPos;
  QRect actionRect;
  QRect screen;
  QWidget *in_stack_fffffffffffffee8;
  QRect *in_stack_fffffffffffffef0;
  QWidget *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int iVar13;
  QMenuPrivate *in_stack_ffffffffffffff18;
  QMenuPrivate *in_stack_ffffffffffffff20;
  QMenu *in_stack_ffffffffffffff68;
  QPoint local_40;
  QRect local_38;
  QRect local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QMenu *)0x641950);
  pQVar7 = ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x641966);
  if (pQVar7 != (QMenu *)0x0) {
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0x641984);
    pQVar8 = menuAction((QMenu *)0x64198c);
    if (pQVar8 != pQVar6->currentAction) {
      QMenuPrivate::hideMenu(in_stack_ffffffffffffff20,in_stack_ffffffffffffff68);
    }
  }
  if (((pQVar6->currentAction != (QAction *)0x0) && (uVar9 = QAction::isEnabled(), (uVar9 & 1) != 0)
      ) && (pQVar7 = QAction::menu<QMenu*>((QAction *)0x6419e2), pQVar7 != (QMenu *)0x0)) {
    QAction::menu<QMenu*>((QAction *)0x6419f9);
    bVar1 = QWidget::isEnabled((QWidget *)0x641a01);
    if (bVar1) {
      QAction::menu<QMenu*>((QAction *)0x641a18);
      bVar1 = QWidget::isVisible((QWidget *)0x641a20);
      if (!bVar1) {
        QAction::menu<QMenu*>((QAction *)0x641a3c);
        QPointer<QMenu>::operator=
                  ((QPointer<QMenu> *)in_stack_fffffffffffffef0,(QMenu *)in_stack_fffffffffffffee8);
        QPointer<QMenu>::operator->((QPointer<QMenu> *)0x641a61);
        d_func((QMenu *)0x641a69);
        QPointer<QWidget>::operator=
                  ((QPointer<QWidget> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        QPointer<QMenu>::operator->((QPointer<QMenu> *)0x641a9f);
        d_func((QMenu *)0x641aa7);
        QPointer<QAction>::operator=
                  ((QPointer<QAction> *)in_stack_fffffffffffffef0,
                   (QAction *)in_stack_fffffffffffffee8);
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QRect::QRect(in_stack_fffffffffffffef0);
        bVar2 = bypassGraphicsProxyWidget(in_stack_fffffffffffffee8);
        bVar1 = false;
        if (!bVar2) {
          pQVar10 = QWidgetPrivate::nearestGraphicsProxyWidget(in_stack_fffffffffffffee8);
          bVar1 = pQVar10 != (QGraphicsProxyWidget *)0x0;
        }
        if (bVar1) {
          local_28 = QMenuPrivate::popupGeometry
                               ((QMenuPrivate *)
                                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                (QScreen *)in_stack_fffffffffffffef8);
          local_18 = (undefined1 *)local_28._0_8_;
          local_10 = (undefined1 *)local_28._8_8_;
        }
        else {
          in_stack_ffffffffffffff18 = pQVar6;
          local_40 = QWidget::pos(in_stack_fffffffffffffef8);
          QGuiApplication::screenAt((QPoint *)&local_40);
          local_38 = QMenuPrivate::popupGeometry
                               ((QMenuPrivate *)
                                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                (QScreen *)in_stack_fffffffffffffef8);
          local_18 = (undefined1 *)local_38._0_8_;
          local_10 = (undefined1 *)local_38._8_8_;
        }
        pQVar11 = QWidget::style(in_stack_fffffffffffffee8);
        iVar3 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x57,0,in_RDI);
        QMenuPrivate::actionRect
                  ((QMenuPrivate *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (QAction *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        bVar1 = QWidget::isRightToLeft((QWidget *)0x641c41);
        if (bVar1) {
          in_stack_ffffffffffffff10 = -iVar3;
          iVar3 = QRect::width((QRect *)in_stack_fffffffffffffee8);
          iVar3 = (in_stack_ffffffffffffff10 - iVar3) + 1;
        }
        iVar13 = iVar3;
        iVar4 = QRect::right((QRect *)0x641c9b);
        iVar4 = iVar4 + iVar3;
        QRect::top((QRect *)0x641cb0);
        QPoint::QPoint((QPoint *)in_stack_fffffffffffffef0,
                       (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                       (int)in_stack_fffffffffffffee8);
        QWidget::mapToGlobal
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (QPoint *)in_stack_fffffffffffffef8);
        iVar3 = QPoint::x((QPoint *)0x641cea);
        iVar5 = QRect::right((QRect *)0x641cfb);
        if (iVar5 < iVar3) {
          QWidget::geometry(in_RDI);
          QRect::left((QRect *)0x641d17);
          QPoint::setX((QPoint *)in_stack_fffffffffffffef0,
                       (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        }
        QPointer<QMenu>::operator->((QPointer<QMenu> *)0x641d46);
        QWidget::actions(in_stack_fffffffffffffef8);
        bVar1 = QList<QAction_*>::isEmpty((QList<QAction_*> *)0x641d6d);
        if (!bVar1) {
          in_stack_fffffffffffffef8 =
               &QPointer<QMenu>::operator->((QPointer<QMenu> *)0x641da4)->super_QWidget;
          QList<QAction_*>::first((QList<QAction_*> *)in_stack_fffffffffffffef0);
          actionGeometry((QMenu *)in_stack_fffffffffffffef0,(QAction *)in_stack_fffffffffffffee8);
          in_stack_ffffffffffffff04 = QRect::top((QRect *)0x641ddd);
          piVar12 = QPoint::ry((QPoint *)0x641dee);
          *piVar12 = *piVar12 - in_stack_ffffffffffffff04;
        }
        QPointer<QMenu>::operator->((QPointer<QMenu> *)0x641e09);
        popup((QMenu *)in_stack_ffffffffffffff18,
              (QPoint *)CONCAT44(iVar13,in_stack_ffffffffffffff10),(QAction *)CONCAT44(iVar3,iVar4))
        ;
        pQVar8 = pQVar6->currentAction;
        ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x641e4e);
        QMenuSloppyState::setSubMenuPopup
                  ((QMenuSloppyState *)CONCAT44(iVar3,iVar4),
                   (QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (QAction *)in_stack_fffffffffffffef8,(QMenu *)pQVar8);
        bVar1 = QWidget::underMouse((QWidget *)0x641e71);
        if (bVar1) {
          QEvent::QEvent((QEvent *)&stack0xffffffffffffff68,Leave);
          QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&stack0xffffffffffffff68);
          QEvent::~QEvent((QEvent *)&stack0xffffffffffffff68);
        }
        QList<QAction_*>::~QList((QList<QAction_*> *)0x641ed3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::internalDelayedPopup()
{
    Q_D(QMenu);
    //hide the current item
    if (QMenu *menu = d->activeMenu) {
        if (d->activeMenu->menuAction() != d->currentAction)
            d->hideMenu(menu);
    }

    if (!d->currentAction || !d->currentAction->isEnabled() || !d->currentAction->menu() ||
        !d->currentAction->menu()->isEnabled() || d->currentAction->menu()->isVisible())
        return;

    //setup
    d->activeMenu = d->currentAction->menu();
    d->activeMenu->d_func()->causedPopup.widget = this;
    d->activeMenu->d_func()->causedPopup.action = d->currentAction;

    QRect screen;
#if QT_CONFIG(graphicsview)
    bool isEmbedded = !bypassGraphicsProxyWidget(this) && QMenuPrivate::nearestGraphicsProxyWidget(this);
    if (isEmbedded)
        screen = d->popupGeometry();
    else
#endif
    screen = d->popupGeometry(QGuiApplication::screenAt(pos()));

    int subMenuOffset = style()->pixelMetric(QStyle::PM_SubMenuOverlap, nullptr, this);
    const QRect actionRect(d->actionRect(d->currentAction));
    const auto ofs = isRightToLeft() ? (-subMenuOffset - actionRect.width() + 1) : subMenuOffset;
    QPoint subMenuPos(mapToGlobal(QPoint(actionRect.right() + ofs, actionRect.top())));
    if (subMenuPos.x() > screen.right())
        subMenuPos.setX(geometry().left());

    const auto &subMenuActions = d->activeMenu->actions();
    if (!subMenuActions.isEmpty()) {
        // Offset by the submenu's 1st action position to align with the current action
        const auto subMenuActionRect = d->activeMenu->actionGeometry(subMenuActions.first());
        subMenuPos.ry() -= subMenuActionRect.top();
    }

    d->activeMenu->popup(subMenuPos);
    d->sloppyState.setSubMenuPopup(actionRect, d->currentAction, d->activeMenu);

#if !defined(Q_OS_DARWIN)
    // Send the leave event to the current menu - only active popup menu gets
    // mouse enter/leave events. Currently Cocoa is an exception, so disable
    // it there to avoid event duplication.
    if (underMouse()) {
        QEvent leaveEvent(QEvent::Leave);
        QCoreApplication::sendEvent(this, &leaveEvent);
    }
#endif
}